

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQTWrapCPPCommand.cxx
# Opt level: O0

bool cmQTWrapCPPCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args,cmExecutionStatus *status)

{
  string_view value;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> ilist;
  cmSourceFile *this;
  undefined8 name;
  cmExecutionStatus *this_00;
  bool bVar1;
  size_type sVar2;
  cmMakefile *this_01;
  string *psVar3;
  cmSourceFile *pcVar4;
  ulong uVar5;
  pointer pcVar6;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  cVar7;
  undefined1 auVar8 [16];
  bool local_3b9;
  function<void_(cmSourceFile_*)> local_348;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_328;
  cmCustomCommandLines local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_308;
  string local_2f0;
  unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_> local_2d0;
  __single_object cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  basic_string_view<char,_std::char_traits<char>_> local_2a0;
  undefined1 local_290 [16];
  undefined1 local_280 [16];
  pointer *local_270;
  undefined8 local_268;
  undefined1 local_260 [8];
  cmCustomCommandLines commandLines;
  string hname;
  string local_220;
  string *local_200;
  allocator<char> local_1f1;
  string local_1f0;
  cmSourceFile *local_1d0;
  cmSourceFile *sf;
  cmAlphaNum local_198;
  undefined1 local_168 [8];
  string newName;
  string srcName;
  string local_120;
  cmSourceFile *local_100;
  cmSourceFile *curr;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_d0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_c0;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  string sourceListValue;
  string *sourceList;
  string local_88;
  string *local_68;
  string *moc_exe;
  cmMakefile *mf;
  allocator<char> local_41;
  string local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  this_00 = local_20;
  if (sVar2 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"called with incorrect number of arguments",&local_41);
    cmExecutionStatus::SetError(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    args_local._7_1_ = 0;
  }
  else {
    this_01 = cmExecutionStatus::GetMakefile(local_20);
    moc_exe = (string *)this_01;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"QT_MOC_EXECUTABLE",(allocator<char> *)((long)&sourceList + 7));
    psVar3 = cmMakefile::GetRequiredDefinition(this_01,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sourceList + 7));
    local_68 = psVar3;
    sourceListValue.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)status_local,1);
    psVar3 = cmMakefile::GetSafeDefinition
                       ((cmMakefile *)moc_exe,(string *)sourceListValue.field_2._8_8_);
    std::__cxx11::string::string((string *)&__range1,(string *)psVar3);
    cVar7 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
    __begin1 = cVar7.Begin._M_current;
    local_d0 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&__begin1,2);
    local_c0 = &local_d0;
    __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin(local_c0);
    arg = (string *)
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          ::end(local_c0);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)&arg);
      psVar3 = moc_exe;
      name = sourceListValue.field_2._8_8_;
      if (!bVar1) break;
      curr = (cmSourceFile *)
             __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
      pcVar4 = cmMakefile::GetSource((cmMakefile *)moc_exe,(string *)curr,Ambiguous);
      srcName.field_2._M_local_buf[0xe] = '\0';
      srcName.field_2._M_local_buf[0xd] = '\0';
      local_3b9 = false;
      local_100 = pcVar4;
      if (pcVar4 != (cmSourceFile *)0x0) {
        std::allocator<char>::allocator();
        srcName.field_2._M_local_buf[0xe] = '\x01';
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_120,"WRAP_EXCLUDE",
                   (allocator<char> *)(srcName.field_2._M_local_buf + 0xf));
        srcName.field_2._M_local_buf[0xd] = '\x01';
        local_3b9 = cmSourceFile::GetPropertyAsBool(pcVar4,&local_120);
      }
      if ((srcName.field_2._M_local_buf[0xd] & 1U) != 0) {
        std::__cxx11::string::~string((string *)&local_120);
      }
      if ((srcName.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)(srcName.field_2._M_local_buf + 0xf));
      }
      if (((local_3b9 ^ 0xffU) & 1) != 0) {
        cmsys::SystemTools::GetFilenameWithoutLastExtension
                  ((string *)((long)&newName.field_2 + 8),(string *)curr);
        psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)moc_exe);
        cmAlphaNum::cmAlphaNum(&local_198,psVar3);
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&sf,"/moc_");
        cmStrCat<std::__cxx11::string,char[5]>
                  ((string *)local_168,&local_198,(cmAlphaNum *)&sf,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&newName.field_2 + 8),(char (*) [5])0xdefabf);
        pcVar4 = cmMakefile::GetOrCreateSource
                           ((cmMakefile *)moc_exe,(string *)local_168,true,Ambiguous);
        local_1d0 = pcVar4;
        if (local_100 != (cmSourceFile *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f0,"ABSTRACT",&local_1f1);
          this = local_100;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_220,"ABSTRACT",
                     (allocator<char> *)(hname.field_2._M_local_buf + 0xf));
          local_200 = (string *)cmSourceFile::GetProperty(this,&local_220);
          cmSourceFile::SetProperty(pcVar4,&local_1f0,(cmValue)local_200);
          std::__cxx11::string::~string((string *)&local_220);
          std::allocator<char>::~allocator((allocator<char> *)(hname.field_2._M_local_buf + 0xf));
          std::__cxx11::string::~string((string *)&local_1f0);
          std::allocator<char>::~allocator(&local_1f1);
        }
        std::__cxx11::string::string
                  ((string *)
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        bVar1 = cmsys::SystemTools::FileIsFullPath((string *)curr);
        if (bVar1) {
          std::__cxx11::string::operator=
                    ((string *)
                     &commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)curr);
        }
        else {
          if (local_100 == (cmSourceFile *)0x0) {
LAB_00469487:
            psVar3 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((cmMakefile *)moc_exe);
            std::__cxx11::string::operator=
                      ((string *)
                       &commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar3);
          }
          else {
            bVar1 = cmSourceFile::GetIsGenerated(local_100,GlobalAndLocal);
            if (!bVar1) goto LAB_00469487;
            psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_((cmMakefile *)moc_exe);
            std::__cxx11::string::operator=
                      ((string *)
                       &commandLines.
                        super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                        super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)psVar3);
          }
          std::__cxx11::string::operator+=
                    ((string *)
                     &commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,"/");
          std::__cxx11::string::operator+=
                    ((string *)
                     &commandLines.
                      super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)curr);
        }
        uVar5 = std::__cxx11::string::empty();
        if ((uVar5 & 1) == 0) {
          std::__cxx11::string::operator+=((string *)&__range1,";");
        }
        std::__cxx11::string::operator+=((string *)&__range1,(string *)local_168);
        depends.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_68);
        std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_2a0,"-o");
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_168);
        local_290 = auVar8;
        auVar8 = std::__cxx11::string::operator_cast_to_basic_string_view
                           ((string *)
                            &commandLines.
                             super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             .
                             super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
        local_270 = &depends.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_268 = 4;
        ilist._M_len = 4;
        ilist._M_array = (iterator)local_270;
        local_280 = auVar8;
        cmMakeSingleCommandLine((cmCustomCommandLines *)local_260,ilist);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,local_68);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&cc,(value_type *)
                           &commandLines.
                            super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                            super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::make_unique<cmCustomCommand>();
        pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_2d0);
        std::__cxx11::string::string((string *)&local_2f0,(string *)local_168);
        cmCustomCommand::SetOutputs(pcVar6,&local_2f0);
        std::__cxx11::string::~string((string *)&local_2f0);
        pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_308,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&cc);
        cmCustomCommand::SetDepends(pcVar6,&local_308);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_308);
        pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_2d0);
        cmCustomCommandLines::cmCustomCommandLines(&local_320,(cmCustomCommandLines *)local_260);
        cmCustomCommand::SetCommandLines(pcVar6,&local_320);
        cmCustomCommandLines::~cmCustomCommandLines(&local_320);
        pcVar6 = std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::operator->
                           (&local_2d0);
        cmCustomCommand::SetComment(pcVar6,"Qt Wrapped File");
        psVar3 = moc_exe;
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::unique_ptr
                  (&local_328,&local_2d0);
        std::function<void_(cmSourceFile_*)>::function(&local_348,(nullptr_t)0x0);
        cmMakefile::AddCustomCommandToOutput((cmMakefile *)psVar3,&local_328,&local_348,false);
        std::function<void_(cmSourceFile_*)>::~function(&local_348);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_328);
        std::unique_ptr<cmCustomCommand,_std::default_delete<cmCustomCommand>_>::~unique_ptr
                  (&local_2d0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&cc);
        cmCustomCommandLines::~cmCustomCommandLines((cmCustomCommandLines *)local_260);
        std::__cxx11::string::~string
                  ((string *)
                   &commandLines.
                    super_vector<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    super__Vector_base<cmCustomCommandLine,_std::allocator<cmCustomCommandLine>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::~string((string *)local_168);
        std::__cxx11::string::~string((string *)(newName.field_2._M_local_buf + 8));
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    value = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&__range1);
    cmMakefile::AddDefinition((cmMakefile *)psVar3,(string *)name,value);
    args_local._7_1_ = 1;
    std::__cxx11::string::~string((string *)&__range1);
  }
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmQTWrapCPPCommand(std::vector<std::string> const& args,
                        cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();

  // Get the moc executable to run in the custom command.
  std::string const& moc_exe = mf.GetRequiredDefinition("QT_MOC_EXECUTABLE");

  // Get the variable holding the list of sources.
  std::string const& sourceList = args[1];
  std::string sourceListValue = mf.GetSafeDefinition(sourceList);

  // Create a rule for all sources listed.
  for (std::string const& arg : cmMakeRange(args).advance(2)) {
    cmSourceFile* curr = mf.GetSource(arg);
    // if we should wrap the class
    if (!(curr && curr->GetPropertyAsBool("WRAP_EXCLUDE"))) {
      // Compute the name of the file to generate.
      std::string srcName =
        cmSystemTools::GetFilenameWithoutLastExtension(arg);
      std::string newName =
        cmStrCat(mf.GetCurrentBinaryDirectory(), "/moc_", srcName, ".cxx");
      cmSourceFile* sf = mf.GetOrCreateSource(newName, true);
      if (curr) {
        sf->SetProperty("ABSTRACT", curr->GetProperty("ABSTRACT"));
      }

      // Compute the name of the header from which to generate the file.
      std::string hname;
      if (cmSystemTools::FileIsFullPath(arg)) {
        hname = arg;
      } else {
        if (curr && curr->GetIsGenerated()) {
          hname = mf.GetCurrentBinaryDirectory();
        } else {
          hname = mf.GetCurrentSourceDirectory();
        }
        hname += "/";
        hname += arg;
      }

      // Append the generated source file to the list.
      if (!sourceListValue.empty()) {
        sourceListValue += ";";
      }
      sourceListValue += newName;

      // Create the custom command to generate the file.
      cmCustomCommandLines commandLines =
        cmMakeSingleCommandLine({ moc_exe, "-o", newName, hname });

      std::vector<std::string> depends;
      depends.push_back(moc_exe);
      depends.push_back(hname);

      auto cc = cm::make_unique<cmCustomCommand>();
      cc->SetOutputs(newName);
      cc->SetDepends(depends);
      cc->SetCommandLines(commandLines);
      cc->SetComment("Qt Wrapped File");
      mf.AddCustomCommandToOutput(std::move(cc));
    }
  }

  // Store the final list of source files.
  mf.AddDefinition(sourceList, sourceListValue);
  return true;
}